

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Designator_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Designator_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Designator_PDU *this)

{
  ostream *poVar1;
  KString local_2b0;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Designator_PDU *local_18;
  Designator_PDU *this_local;
  
  local_18 = this;
  this_local = (Designator_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Designator PDU-\n");
  poVar1 = std::operator<<(poVar1,"Designating Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_210,&this->m_DesignatingEntityID);
  UTILS::IndentString(&local_1f0,&local_210,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"Code Name:                   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16CodeName);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Designated Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_250,&this->m_DesignatedEntityID);
  UTILS::IndentString(&local_230,&local_250,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,"Code:                        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Code);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Power(watts):                ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Power);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Wave Length(microns):        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32WaveLength);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Spot Location(Entity):       ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_270,&this->m_SpotRegardsToEntity);
  poVar1 = std::operator<<(poVar1,(string *)&local_270);
  poVar1 = std::operator<<(poVar1,"Spot World Location:         ");
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_290,&this->m_SpotLocation);
  poVar1 = std::operator<<(poVar1,(string *)&local_290);
  poVar1 = std::operator<<(poVar1,"Dead Reckoning Algorithm:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8DeadReckoningAlgorithm);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Entity Linear Acceleration:  ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_2b0,&this->m_EntityLinearAcceleration);
  std::operator<<(poVar1,(string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Designator_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Designator PDU-\n"
       << "Designating Entity ID:\n"
       << IndentString( m_DesignatingEntityID.GetAsString(), 1 )
       << "Code Name:                   " << m_ui16CodeName                            << "\n"
       << "Designated Entity ID:\n"
       << IndentString( m_DesignatedEntityID.GetAsString(), 1 )
       << "Code:                        " << m_ui16Code                                << "\n"
       << "Power(watts):                " << m_f32Power                                << "\n"
       << "Wave Length(microns):        " << m_f32WaveLength                           << "\n"
       << "Spot Location(Entity):       " << m_SpotRegardsToEntity.GetAsString()
       << "Spot World Location:         " << m_SpotLocation.GetAsString()
       << "Dead Reckoning Algorithm:    " << ( KUINT16 )m_ui8DeadReckoningAlgorithm    << "\n"
       << "Entity Linear Acceleration:  " << m_EntityLinearAcceleration.GetAsString();

    return ss.str();
}